

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> __thiscall
wabt::MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location&>
          (wabt *this,Var *args,Location *args_1)

{
  StartModuleField *this_00;
  Var local_68;
  Location *local_20;
  Location *args_local_1;
  Var *args_local;
  
  local_20 = args_1;
  args_local_1 = &args->loc;
  args_local = (Var *)this;
  this_00 = (StartModuleField *)operator_new(0x88);
  Var::Var(&local_68,(Var *)args_local_1);
  StartModuleField::StartModuleField(this_00,&local_68,local_20);
  std::unique_ptr<wabt::StartModuleField,std::default_delete<wabt::StartModuleField>>::
  unique_ptr<std::default_delete<wabt::StartModuleField>,void>
            ((unique_ptr<wabt::StartModuleField,std::default_delete<wabt::StartModuleField>> *)this,
             this_00);
  Var::~Var(&local_68);
  return (__uniq_ptr_data<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}